

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  secp256k1_fe *r;
  secp256k1_fe *b;
  ulong uVar1;
  secp256k1_ge_storage *a;
  long lVar2;
  secp256k1_fe zr;
  secp256k1_gej pj;
  secp256k1_fe zi;
  secp256k1_ge last_ge;
  secp256k1_gej d;
  secp256k1_fe dx_over_dz_squared;
  secp256k1_fe zi2;
  secp256k1_ge d_ge;
  secp256k1_ge a_ge;
  secp256k1_fe local_418;
  uint64_t local_3e8;
  uint64_t uStack_3e0;
  uint64_t local_3d8;
  uint64_t uStack_3d0;
  secp256k1_ge local_3c8;
  secp256k1_gej local_368;
  secp256k1_fe local_2e8;
  secp256k1_ge local_2c0;
  secp256k1_gej local_268;
  secp256k1_fe local_1e8;
  secp256k1_fe local_1b8;
  secp256k1_fe local_190;
  secp256k1_ge local_168;
  secp256k1_ge local_110;
  secp256k1_gej local_b8;
  
  secp256k1_context_preallocated_size(flags);
  *(secp256k1_callback *)((long)prealloc + 0xc0) = default_error_callback;
  if ((char)flags == '\x01') {
    *(undefined1 (*) [16])prealloc = (undefined1  [16])0x0;
    if ((flags >> 9 & 1) != 0) {
      *(secp256k1_ge_storage (**) [16])((long)prealloc + 8) = secp256k1_ecmult_static_context;
      secp256k1_ecmult_gen_blind((secp256k1_ecmult_gen_context *)((long)prealloc + 8),(uchar *)0x0);
    }
    if (((flags >> 8 & 1) != 0) && (*prealloc == 0)) {
      lVar2 = 0;
      local_b8.infinity = 0;
      local_b8.x.n[0] = 0x2815b16f81798;
      local_b8.x.n[1] = 0xdb2dce28d959f;
      local_b8.x.n[2] = 0xe870b07029bfc;
      local_b8.x.n[3] = 0xbbac55a06295c;
      local_b8.x.n[4] = 0x79be667ef9dc;
      local_b8.y.n[0] = 0x7d08ffb10d4b8;
      local_b8.y.n[1] = 0x48a68554199c4;
      local_b8.y.n[2] = 0xe1108a8fd17b4;
      local_b8.y.n[3] = 0xc4655da4fbfc0;
      local_b8.y.n[4] = 0x483ada7726a3;
      local_b8.z.n[0] = 1;
      local_b8.z.n[1] = 0;
      local_b8.z.n[2] = 0;
      local_b8.z.n[3] = 0;
      local_b8.z.n[4] = 0;
      *(long *)prealloc = (long)prealloc + 0xd0;
      secp256k1_gej_double_var(&local_268,&local_b8,(secp256k1_fe *)0x0);
      local_168.x.n[4] = local_268.x.n[4];
      local_168.x.n[2] = local_268.x.n[2];
      local_168.x.n[3] = local_268.x.n[3];
      local_168.x.n[0] = local_268.x.n[0];
      local_168.x.n[1] = local_268.x.n[1];
      local_168.y.n[0] = local_268.y.n[0];
      local_168.y.n[1] = local_268.y.n[1];
      local_168.y.n[2] = local_268.y.n[2];
      local_168.y.n[3] = local_268.y.n[3];
      local_168.y.n[4] = local_268.y.n[4];
      local_168.infinity = 0;
      secp256k1_ge_set_gej_zinv(&local_110,&local_b8,&local_268.z);
      local_368.x.n[4] = local_110.x.n[4];
      local_368.x.n[2] = local_110.x.n[2];
      local_368.x.n[3] = local_110.x.n[3];
      local_368.x.n[0] = local_110.x.n[0];
      local_368.x.n[1] = local_110.x.n[1];
      local_368.y.n[0] = local_110.y.n[0];
      local_368.y.n[1] = local_110.y.n[1];
      local_368.y.n[2] = local_110.y.n[2];
      local_368.y.n[3] = local_110.y.n[3];
      local_368.y.n[4] = local_110.y.n[4];
      r = &local_368.z;
      local_368.z.n[0] = local_b8.z.n[0];
      local_368.z.n[1] = local_b8.z.n[1];
      local_368.z.n[2] = local_b8.z.n[2];
      local_368.z.n[3] = local_b8.z.n[3];
      local_368.z.n[4] = local_b8.z.n[4];
      local_368.infinity = 0;
      local_418.n[4] = local_268.z.n[4];
      local_418.n[2] = local_268.z.n[2];
      local_418.n[3] = local_268.z.n[3];
      local_418.n[0] = local_268.z.n[0];
      local_418.n[1] = local_268.z.n[1];
      secp256k1_fe_normalize_var(&local_418);
      *(uint64_t *)((long)prealloc + 0xd0) = local_418.n[1] << 0x34 | local_418.n[0];
      *(uint64_t *)((long)prealloc + 0xd8) = local_418.n[2] << 0x28 | local_418.n[1] >> 0xc;
      *(uint64_t *)((long)prealloc + 0xe0) = local_418.n[3] << 0x1c | local_418.n[2] >> 0x18;
      *(uint64_t *)((long)prealloc + 0xe8) = local_418.n[4] << 0x10 | local_418.n[3] >> 0x24;
      secp256k1_fe_normalize_var(&local_368.y);
      *(uint64_t *)((long)prealloc + 0xf0) = local_368.y.n[1] << 0x34 | local_368.y.n[0];
      *(uint64_t *)((long)prealloc + 0xf8) = local_368.y.n[2] << 0x28 | local_368.y.n[1] >> 0xc;
      *(uint64_t *)((long)prealloc + 0x100) = local_368.y.n[3] << 0x1c | local_368.y.n[2] >> 0x18;
      *(uint64_t *)((long)prealloc + 0x108) = local_368.y.n[4] << 0x10 | local_368.y.n[3] >> 0x24;
      do {
        secp256k1_gej_add_ge_var(&local_368,&local_368,&local_168,&local_418);
        secp256k1_fe_normalize_var(&local_418);
        *(uint64_t *)((long)prealloc + lVar2 + 0x110) = local_418.n[1] << 0x34 | local_418.n[0];
        *(uint64_t *)((long)prealloc + lVar2 + 0x118) =
             local_418.n[2] << 0x28 | local_418.n[1] >> 0xc;
        *(uint64_t *)((long)prealloc + lVar2 + 0x120) =
             local_418.n[3] << 0x1c | local_418.n[2] >> 0x18;
        *(uint64_t *)((long)prealloc + lVar2 + 0x128) =
             local_418.n[4] << 0x10 | local_418.n[3] >> 0x24;
        secp256k1_fe_normalize_var(&local_368.y);
        *(uint64_t *)((long)prealloc + lVar2 + 0x130) = local_368.y.n[1] << 0x34 | local_368.y.n[0];
        *(uint64_t *)((long)prealloc + lVar2 + 0x138) =
             local_368.y.n[2] << 0x28 | local_368.y.n[1] >> 0xc;
        *(uint64_t *)((long)prealloc + lVar2 + 0x140) =
             local_368.y.n[3] << 0x1c | local_368.y.n[2] >> 0x18;
        *(uint64_t *)((long)prealloc + lVar2 + 0x148) =
             local_368.y.n[4] << 0x10 | local_368.y.n[3] >> 0x24;
        lVar2 = lVar2 + 0x40;
      } while (lVar2 != 0xfffc0);
      b = &local_268.z;
      secp256k1_fe_mul(r,r,b);
      secp256k1_fe_inv(&local_2e8,r);
      secp256k1_ge_set_gej_zinv(&local_3c8,&local_368,&local_2e8);
      secp256k1_ge_from_storage(&local_2c0,(secp256k1_ge_storage *)((long)prealloc + 0x100090));
      secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)prealloc + 0x100090),&local_3c8);
      secp256k1_fe_inv(b,b);
      secp256k1_fe_sqr(&local_1e8,b);
      secp256k1_fe_mul(&local_1e8,&local_1e8,&local_268.x);
      local_3d8 = local_1e8.n[0];
      uStack_3d0 = local_1e8.n[1];
      local_3e8 = local_1e8.n[2];
      uStack_3e0 = local_1e8.n[3];
      a = (secp256k1_ge_storage *)((long)prealloc + 0x100050);
      uVar1 = 0x4000;
      do {
        secp256k1_fe_mul(&local_2e8,&local_2e8,&local_2c0.x);
        secp256k1_fe_sqr(&local_190,&local_2e8);
        secp256k1_fe_mul(&local_1b8,&local_190,&local_2e8);
        secp256k1_fe_mul(&local_3c8.x,&local_2c0.x,&local_190);
        local_3c8.x.n[0] = (local_3d8 - local_3c8.x.n[0]) + 0x3ffffbfffff0bc;
        local_3c8.x.n[1] = (uStack_3d0 - local_3c8.x.n[1]) + 0x3ffffffffffffc;
        local_3c8.x.n[2] = (local_3e8 - local_3c8.x.n[2]) + 0x3ffffffffffffc;
        local_3c8.x.n[3] = (uStack_3e0 - local_3c8.x.n[3]) + 0x3ffffffffffffc;
        local_3c8.x.n[4] = (local_1e8.n[4] - local_3c8.x.n[4]) + 0x3fffffffffffc;
        secp256k1_ge_from_storage(&local_2c0,a);
        secp256k1_fe_mul(&local_3c8.y,&local_2c0.y,&local_1b8);
        secp256k1_ge_to_storage(a,&local_3c8);
        uVar1 = uVar1 - 1;
        a = a + -1;
      } while (1 < uVar1);
    }
  }
  else {
    secp256k1_context_preallocated_create_cold_1();
    prealloc = (secp256k1_context *)0x0;
  }
  return (secp256k1_context *)prealloc;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    void* const base = prealloc;
    size_t prealloc_size;
    secp256k1_context* ret;

    VERIFY_CHECK(prealloc != NULL);
    prealloc_size = secp256k1_context_preallocated_size(flags);
    ret = (secp256k1_context*)manual_alloc(&prealloc, sizeof(secp256k1_context), base, prealloc_size);
    ret->error_callback = default_error_callback;

    if (EXPECT((flags & SECP256K1_FLAGS_TYPE_MASK) != SECP256K1_FLAGS_TYPE_CONTEXT, 0)) {
            secp256k1_callback_call(&ret->illegal_callback,
                                    "Invalid flags");
            return NULL;
    }

    secp256k1_ecmult_context_init(&ret->ecmult_ctx);
    secp256k1_ecmult_gen_context_init(&ret->ecmult_gen_ctx);

    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_SIGN) {
        secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx, &prealloc);
    }
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_VERIFY) {
        secp256k1_ecmult_context_build(&ret->ecmult_ctx, &prealloc);
    }

    return (secp256k1_context*)ret;
}